

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_default_xml_generator.hpp
# Opt level: O2

void __thiscall
iutest::DefaultXmlGeneratorListener::DefaultXmlGeneratorListener
          (DefaultXmlGeneratorListener *this,string *path)

{
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__DefaultXmlGeneratorListener_00134210;
  (this->m_output_path_format)._M_dataplus._M_p = (pointer)&(this->m_output_path_format).field_2;
  (this->m_output_path_format)._M_string_length = 0;
  (this->m_output_path_format).field_2._M_local_buf[0] = '\0';
  (this->m_output_path)._M_dataplus._M_p = (pointer)&(this->m_output_path).field_2;
  (this->m_output_path)._M_string_length = 0;
  (this->m_output_path).field_2._M_local_buf[0] = '\0';
  this->m_fp = (IFile *)0x0;
  SetFilePath(this,path);
  return;
}

Assistant:

explicit DefaultXmlGeneratorListener(const ::std::string& path)
        : m_fp(NULL)
    {
        SetFilePath(path);
    }